

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O1

void web_server_callback(http_parser_t *parser,http_message_t *req,SOCKINFO *info)

{
  char cVar1;
  virtual_Dir_List *pvVar2;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  LinkedList *list;
  str_int_entry *psVar6;
  int iVar7;
  uint uVar8;
  UpnpFileInfo *p;
  char *in;
  void *pvVar9;
  void *__n;
  char *pcVar10;
  UpnpListHead *pUVar11;
  off_t oVar12;
  ListNode *pLVar13;
  size_t sVar14;
  ushort **ppuVar15;
  UpnpExtraHeaders *p_00;
  UpnpListIter pos;
  char *pcVar16;
  char *pcVar17;
  http_header_t *phVar18;
  SendInstruction *pSVar19;
  byte bVar20;
  long lVar21;
  str_int_entry *psVar22;
  char *fmt;
  ulong uVar23;
  xml_alias_t *pxVar24;
  xml_alias_t *pxVar25;
  str_int_entry *psVar26;
  undefined8 uVar27;
  ulong __size;
  char *pcVar28;
  char *pcVar29;
  uint local_72c;
  char *local_728;
  time_t aux_LastModified;
  http_parser_t *local_708;
  int timeout;
  undefined4 local_6f8;
  undefined4 local_6ec;
  int resp_minor;
  int resp_major;
  UpnpFileInfo *local_6e0;
  str_int_entry *local_6d8;
  LinkedList *local_6d0;
  str_int_entry *local_6c8;
  membuffer filename;
  membuffer headers;
  char *RetPtr;
  size_t dummy;
  SendInstruction RespInstr;
  xml_alias_t xmldoc;
  char Buf [1024];
  
  bVar20 = 0;
  timeout = -1;
  local_72c = 0;
  local_708 = parser;
  memset(&RespInstr,0,0x1d0);
  membuffer_init(&headers);
  membuffer_init(&filename);
  print_http_headers(req);
  if ((2 < req->method - HTTPMETHOD_GET) && (req->method != HTTPMETHOD_SIMPLEGET)) {
    __assert_fail("req->method == HTTPMETHOD_GET || req->method == HTTPMETHOD_HEAD || req->method == HTTPMETHOD_POST || req->method == HTTPMETHOD_SIMPLEGET"
                  ,".upnp/src/genlib/net/http/webserver.c",0x4ba,
                  "int process_request(SOCKINFO *, http_message_t *, enum resp_type *, membuffer *, membuffer *, struct xml_alias_t *, struct SendInstruction *)"
                 );
  }
  p = UpnpFileInfo_new();
  http_CalcResponseVersion(req->major_version,req->minor_version,&resp_major,&resp_minor);
  sVar14 = (req->uri).pathquery.size;
  in = (char *)malloc(sVar14 + 1);
  if (in == (char *)0x0) {
    bVar5 = false;
    iVar7 = 500;
    goto LAB_0011a6c5;
  }
  memcpy(in,(req->uri).pathquery.buff,sVar14);
  in[sVar14] = '\0';
  dummy = sVar14;
  remove_escaped_chars(in,&dummy);
  iVar7 = remove_dots(in,(req->uri).pathquery.size);
  if (iVar7 == 0) {
    if (*in == '/') {
      pvVar9 = (void *)((long)HandleTable + 0x5e1);
      local_6f8 = 0x13e001;
      for (pvVar2 = pVirtualDirList; pvVar2 != (virtualDirList *)0x0; pvVar2 = pvVar2->next) {
        pcVar10 = pvVar2->dirName;
        __n = (void *)strlen(pcVar10);
        pvVar9 = __n;
        if (__n != (void *)0x0) {
          cVar1 = pcVar10[(long)__n + -1];
          uVar8 = strncmp(pcVar10,in,(size_t)__n);
          pvVar9 = (void *)(ulong)uVar8;
          if (cVar1 == '/') {
            if (uVar8 == 0) {
LAB_0011a570:
              pvVar9 = pvVar2->cookie;
              local_6f8 = 0;
              RespInstr.Cookie = pvVar9;
              break;
            }
          }
          else if (((uVar8 == 0) &&
                   (pvVar9 = (void *)(ulong)(byte)in[(long)__n], pvVar9 < (void *)0x40)) &&
                  ((0x8000800000000001U >> ((ulong)pvVar9 & 0x3f) & 1) != 0)) goto LAB_0011a570;
        }
      }
      if ((char)local_6f8 == '\0') {
        RespInstr.IsVirtualFile = 1;
        iVar7 = membuffer_assign_str(&filename,in);
        bVar5 = false;
        if (iVar7 != 0) {
          iVar7 = 500;
          goto LAB_0011a6c2;
        }
        local_6ec = 1;
      }
      else {
        local_6ec = (undefined4)CONCAT71((int7)((ulong)pvVar9 >> 8),1);
        if (gAliasDoc.doc.buf == (char *)0x0) {
          bVar5 = false;
        }
        else {
          pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
          if (gAliasDoc.doc.buf == (char *)0x0) {
            __assert_fail("is_valid_alias(&gAliasDoc)",".upnp/src/genlib/net/http/webserver.c",0x18a
                          ,"void alias_grab(struct xml_alias_t *)");
          }
          pxVar24 = &gAliasDoc;
          pxVar25 = &xmldoc;
          for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
            (pxVar25->name).buf = (pxVar24->name).buf;
            pxVar24 = (xml_alias_t *)((long)pxVar24 + ((ulong)bVar20 * -2 + 1) * 8);
            pxVar25 = (xml_alias_t *)((long)pxVar25 + (ulong)bVar20 * -0x10 + 8);
          }
          *xmldoc.ct = *xmldoc.ct + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
          iVar7 = strcmp(xmldoc.name.buf,in);
          bVar5 = true;
          if (iVar7 == 0) {
            UpnpFileInfo_set_FileLength(p,xmldoc.doc.length);
            local_6ec = 0;
            UpnpFileInfo_set_IsDirectory(p,0);
            bVar5 = true;
            UpnpFileInfo_set_IsReadable(p,1);
            UpnpFileInfo_set_LastModified(p,xmldoc.last_modified);
            UpnpFileInfo_set_ContentType(p,"text/xml; charset=\"utf-8\"");
            pcVar10 = UpnpFileInfo_get_ContentType(p);
            if (pcVar10 == (char *)0x0) {
              local_72c = 0;
              iVar7 = 500;
              bVar5 = true;
              goto LAB_0011a6c5;
            }
          }
        }
      }
      local_6e0 = p;
      if ((char)local_6f8 == '\0') {
        if (req->method == HTTPMETHOD_POST) goto LAB_0011ab66;
        local_6d0 = (LinkedList *)UpnpFileInfo_get_ExtraHeadersList(p);
        pLVar13 = ListHead(&req->headers);
        iVar7 = 200;
        bVar4 = true;
        if (pLVar13 != (ListNode *)0x0) {
          do {
            puVar3 = (undefined8 *)pLVar13->item;
            iVar7 = map_str_to_int((char *)*puVar3,puVar3[1],Http_Header_Names,0x21,0);
            if (iVar7 < 0) {
              p_00 = UpnpExtraHeaders_new();
              if (p_00 == (UpnpExtraHeaders *)0x0) {
                FreeExtraHTTPHeaders((UpnpListHead *)local_6d0);
                iVar7 = 500;
                bVar4 = false;
                p = local_6e0;
                goto LAB_0011b4a9;
              }
              pUVar11 = UpnpExtraHeaders_get_node(p_00);
              list = local_6d0;
              pos = UpnpListEnd((UpnpListHead *)local_6d0);
              UpnpListInsert((UpnpListHead *)list,pos,pUVar11);
              UpnpExtraHeaders_strncpy_name(p_00,(char *)*puVar3,puVar3[1]);
              UpnpExtraHeaders_strncpy_value(p_00,(char *)puVar3[3],puVar3[4]);
              p = local_6e0;
            }
            pLVar13 = ListNext(&req->headers,pLVar13);
          } while (pLVar13 != (ListNode *)0x0);
          iVar7 = 200;
          bVar4 = true;
        }
LAB_0011b4a9:
        if (bVar4) {
          UpnpFileInfo_set_CtrlPtIPAddr(p,&info->foreign_sockaddr);
          phVar18 = httpmsg_find_hdr(req,0x18,(memptr *)Buf);
          if (phVar18 != (http_header_t *)0x0) {
            UpnpFileInfo_strncpy_Os(p,(char *)Buf._0_8_,Buf._8_8_);
          }
          iVar7 = (*virtualDirCallback.get_info)
                            (filename.buf,p,RespInstr.Cookie,&RespInstr.RequestCookie);
          if (iVar7 == 0) {
            iVar7 = UpnpFileInfo_get_IsDirectory(p);
            if (iVar7 != 0) {
              pcVar10 = "/index.html";
              if (filename.buf[filename.length - 1] == '/') {
                pcVar10 = "index.html";
              }
              iVar7 = membuffer_append_str(&filename,pcVar10);
              if (iVar7 != 0) goto LAB_0011b566;
              iVar7 = (*virtualDirCallback.get_info)
                                (filename.buf,p,RespInstr.Cookie,&RespInstr.RequestCookie);
              if ((iVar7 != 0) || (iVar7 = UpnpFileInfo_get_IsDirectory(p), iVar7 != 0))
              goto LAB_0011b517;
            }
            iVar7 = UpnpFileInfo_get_IsReadable(p);
            goto joined_r0x0011b74e;
          }
LAB_0011b517:
          iVar7 = 0x194;
        }
      }
      else {
        if ((char)local_6ec != '\0') {
          if (((gDocumentRootDir.length == 0) ||
              (iVar7 = membuffer_assign_str(&filename,gDocumentRootDir.buf), iVar7 != 0)) ||
             (iVar7 = membuffer_append_str(&filename,in), iVar7 != 0)) {
LAB_0011b566:
            iVar7 = 500;
            goto LAB_0011a6c5;
          }
          if (filename.length != 0) {
            do {
              if (filename.buf[filename.length - 1] != '/') break;
              membuffer_delete(&filename,filename.length - 1,1);
            } while (filename.length != 0);
          }
          if (req->method != HTTPMETHOD_POST) {
            iVar7 = get_file_info(filename.buf,p);
            if (iVar7 != 0) {
LAB_0011ab50:
              iVar7 = 0x194;
              goto LAB_0011a6c5;
            }
            iVar7 = UpnpFileInfo_get_IsDirectory(p);
            if (iVar7 != 0) {
              pcVar10 = "/index.html";
              if (filename.buf[filename.length - 1] == '/') {
                pcVar10 = "index.html";
              }
              iVar7 = membuffer_append_str(&filename,pcVar10);
              if (iVar7 != 0) goto LAB_0011b566;
              iVar7 = get_file_info(filename.buf,p);
              if ((iVar7 != 0) || (iVar7 = UpnpFileInfo_get_IsDirectory(p), iVar7 != 0))
              goto LAB_0011ab50;
            }
            iVar7 = UpnpFileInfo_get_IsReadable(p);
joined_r0x0011b74e:
            if (iVar7 == 0) {
              iVar7 = 0x193;
              goto LAB_0011a6c5;
            }
          }
        }
LAB_0011ab66:
        RespInstr.CorsHeader = (void *)gWebserverCorsString.length;
        if (gWebserverCorsString.length != 0) {
          RespInstr.CorsHeader = gWebserverCorsString.buf;
        }
        RespInstr.ReadSendSize = UpnpFileInfo_get_FileLength(p);
        oVar12 = UpnpFileInfo_get_FileLength(p);
        local_728 = (char *)malloc(0xb4);
        if (local_728 == (char *)0x0) {
          iVar7 = 500;
        }
        else {
          local_6d0 = &req->headers;
          pLVar13 = ListHead(local_6d0);
          if (pLVar13 != (ListNode *)0x0) {
            local_6d8 = (str_int_entry *)(oVar12 + -1);
            __size = 0xb4;
            do {
              puVar3 = (undefined8 *)pLVar13->item;
              psVar26 = (str_int_entry *)0x0;
              uVar8 = map_str_to_int((char *)*puVar3,puVar3[1],Http_Header_Names,0x21,0);
              if (__size <= (ulong)puVar3[4]) {
                free(local_728);
                __size = puVar3[4] + 1;
                local_728 = (char *)malloc(__size);
                if (local_728 == (char *)0x0) {
                  iVar7 = 500;
                  p = local_6e0;
                  goto LAB_0011b1d8;
                }
              }
              memcpy(local_728,(void *)puVar3[3],puVar3[4]);
              local_728[puVar3[4]] = '\0';
              if (-1 < (int)uVar8) {
                psVar22 = Http_Header_Names;
                iVar7 = Http_Header_Names[uVar8].id;
                if (iVar7 < 0x23) {
                  if (iVar7 == 3) {
                    iVar7 = atoi(local_728);
                    RespInstr.RecvWriteSize = (long)iVar7;
                  }
                  else if (iVar7 == 0x1c) {
                    if (puVar3[4] + 1 < 0xc9) {
                      memcpy(RespInstr.AcceptLanguageHeader,local_728,puVar3[4] + 1);
                    }
                    else {
                      memcpy(RespInstr.AcceptLanguageHeader,local_728,199);
                      RespInstr.AcceptLanguageHeader[199] = '\0';
                    }
                  }
                }
                else if (iVar7 == 0x23) {
                  RespInstr.IsRangeActive = 1;
                  RespInstr.ReadSendSize = oVar12;
                  pcVar10 = strdup(local_728);
                  iVar7 = 500;
                  if (pcVar10 != (char *)0x0) {
                    pcVar16 = StrStr(pcVar10,"bytes");
                    if ((pcVar16 == (char *)0x0) ||
                       (pcVar16 = StrStr(pcVar10,"="), pcVar16 == (char *)0x0)) {
                      free(pcVar10);
                      RespInstr.IsRangeActive = 0;
                      iVar7 = 400;
                    }
                    else {
                      pcVar17 = pcVar16 + 1;
                      if (oVar12 < 0) {
                        iVar7 = 0x1a0;
                        if (((*pcVar17 == '0') && (pcVar16[2] == '-')) && (pcVar16[3] == '\0')) {
                          RespInstr.IsRangeActive = 0;
                          iVar7 = 200;
                        }
                      }
                      else {
                        aux_LastModified = -1;
                        local_6c8 = (str_int_entry *)0xffffffffffffffff;
                        pcVar16 = strchr(pcVar17,0x2c);
                        if (pcVar16 != (char *)0x0) {
                          *pcVar16 = '\0';
                        }
                        pcVar16 = strchr(pcVar17,0x2d);
                        if (pcVar16 != (char *)0x0) {
                          *pcVar16 = ' ';
                          __isoc99_sscanf(pcVar17,"%ld%ld",&aux_LastModified,&local_6c8);
                          if ((aux_LastModified == -1) ||
                             (psVar22 = (str_int_entry *)aux_LastModified, psVar26 = local_6c8,
                             local_6c8 == (str_int_entry *)0xffffffffffffffff)) {
                            *pcVar16 = '-';
                            sVar14 = strlen(pcVar17);
                            psVar22 = local_6c8;
                            psVar26 = (str_int_entry *)aux_LastModified;
                            if (0 < (int)(uint)sVar14) {
                              uVar23 = 0;
                              do {
                                cVar1 = pcVar17[uVar23];
                                psVar22 = local_6c8;
                                psVar26 = (str_int_entry *)aux_LastModified;
                                if (((long)cVar1 == 0x2d) ||
                                   (ppuVar15 = __ctype_b_loc(),
                                   psVar22 = (str_int_entry *)aux_LastModified, psVar26 = local_6c8,
                                   (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 8) != 0))
                                break;
                                uVar23 = uVar23 + 1;
                                psVar22 = local_6c8;
                                psVar26 = (str_int_entry *)aux_LastModified;
                              } while (((uint)sVar14 & 0x7fffffff) != uVar23);
                            }
                          }
                        }
                        iVar7 = 500;
                        if ((pcVar16 == (char *)0x0) || (oVar12 < (long)psVar22)) {
LAB_0011af40:
                          free(pcVar10);
                          iVar7 = 0x1a0;
                          goto LAB_0011affb;
                        }
                        if ((long)psVar26 < (long)psVar22 ||
                            (long)((ulong)psVar22 | (ulong)psVar26) < 0) {
                          if (((oVar12 - (long)psVar22 != 0 && (long)psVar22 <= oVar12) &&
                              (-1 < (long)psVar22)) &&
                             (psVar6 = (str_int_entry *)(oVar12 - (long)psVar22),
                             psVar26 == (str_int_entry *)0xffffffffffffffff)) goto LAB_0011afe5;
                          if ((long)psVar26 < 1 || psVar22 != (str_int_entry *)0xffffffffffffffff)
                          goto LAB_0011af40;
                          psVar22 = (str_int_entry *)(oVar12 - (long)psVar26);
                          psVar6 = psVar26;
                          if (oVar12 - (long)psVar26 != 0 && (long)psVar26 <= oVar12)
                          goto LAB_0011afe5;
                          RespInstr.RangeOffset = 0;
                          RespInstr.ReadSendSize = oVar12;
                          uVar8 = snprintf(RespInstr.RangeHeader,200,
                                           "CONTENT-RANGE: bytes 0-%ld/%ld\r\n",local_6d8);
                        }
                        else {
                          if (oVar12 <= (long)psVar26) {
                            psVar26 = local_6d8;
                          }
                          psVar6 = (str_int_entry *)((long)psVar26 + (1 - (long)psVar22));
LAB_0011afe5:
                          RespInstr.ReadSendSize = (off_t)psVar6;
                          RespInstr.RangeOffset = (off_t)psVar22;
                          uVar8 = snprintf(RespInstr.RangeHeader,200,
                                           "CONTENT-RANGE: bytes %ld-%ld/%ld\r\n");
                        }
                        if (uVar8 < 200) {
                          free(pcVar10);
                          iVar7 = 200;
                          goto LAB_0011affb;
                        }
                      }
                      free(pcVar10);
                    }
                  }
LAB_0011affb:
                  p = local_6e0;
                  if (iVar7 != 200) goto LAB_0011b1c8;
                }
                else if (iVar7 == 0x24) {
                  RespInstr.IsChunkActive = 1;
                  sVar14 = strlen(local_728);
                  if ((4 < sVar14) &&
                     (pcVar10 = StrStr(local_728,"trailers"), pcVar10 != (char *)0x0)) {
                    RespInstr.IsTrailers = 1;
                  }
                }
              }
              pLVar13 = ListNext(local_6d0,pLVar13);
              p = local_6e0;
            } while (pLVar13 != (ListNode *)0x0);
          }
          iVar7 = 200;
LAB_0011b1c8:
          free(local_728);
        }
LAB_0011b1d8:
        pcVar10 = (char *)&RespInstr;
        if (iVar7 != 200) goto LAB_0011a6c5;
        if (req->method == HTTPMETHOD_POST) {
          local_72c = 4;
          iVar7 = 200;
          goto LAB_0011a6c5;
        }
        if (((char)local_6f8 == '\0') && (oVar12 = UpnpFileInfo_get_FileLength(p), oVar12 == -3)) {
          if ((resp_major != 1) || (resp_minor != 1)) {
            iVar7 = 0x196;
            goto LAB_0011a6c5;
          }
          RespInstr.IsChunkActive = 1;
        }
        aux_LastModified = UpnpFileInfo_get_LastModified(p);
        pcVar16 = (char *)RespInstr.ReadSendSize;
        if (RespInstr.IsRangeActive == 0) {
          if (RespInstr.IsChunkActive == 0) {
            pSVar19 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
            pcVar17 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
            if (-1 < (long)pcVar16) {
              fmt = "RNTLADstcSXcECc";
              uVar27 = 200;
              pcVar29 = "redsonic";
              pcVar28 = (char *)&aux_LastModified;
              pcVar10 = "LAST-MODIFIED: ";
              goto LAB_0011b670;
            }
            pcVar10 = "RTLADstcSXcECc";
          }
          else {
            pSVar19 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
            pcVar17 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
            pcVar10 = "RKTLADstcSXcECc";
          }
          iVar7 = http_MakeMessage(&headers,resp_major,resp_minor,pcVar10,200,pSVar19,&RespInstr,
                                   &RespInstr,"LAST-MODIFIED: ",&aux_LastModified,"redsonic",pcVar17
                                  );
        }
        else {
          if (RespInstr.IsChunkActive == 0) {
            pSVar19 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
            UpnpFileInfo_get_ExtraHeadersList(p);
            fmt = "RNTGLADstcSXcECc";
            uVar27 = 0xce;
            pcVar17 = "redsonic";
            pcVar29 = (char *)&aux_LastModified;
            pcVar28 = "LAST-MODIFIED: ";
          }
          else {
            pcVar16 = UpnpFileInfo_get_ContentType(p);
            pcVar17 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
            pcVar28 = (char *)&aux_LastModified;
            fmt = "RTGKLADstcSXcECc";
            uVar27 = 0xce;
            pcVar29 = "redsonic";
            p = local_6e0;
            pSVar19 = (SendInstruction *)pcVar10;
            pcVar10 = "LAST-MODIFIED: ";
          }
LAB_0011b670:
          iVar7 = http_MakeMessage(&headers,resp_major,resp_minor,fmt,uVar27,pcVar16,pSVar19,
                                   &RespInstr,&RespInstr,pcVar10,pcVar28,pcVar29,pcVar17);
        }
        if (iVar7 == 0) {
          bVar20 = (byte)local_6f8 ^ 1;
          uVar8 = 1;
          if ((char)local_6ec != '\0') {
            uVar8 = (uint)bVar20 + (uint)bVar20 * 2;
          }
          local_72c = 2;
          if (req->method != HTTPMETHOD_HEAD) {
            local_72c = uVar8;
          }
          if (req->method == HTTPMETHOD_SIMPLEGET) {
            membuffer_destroy(&headers);
          }
          iVar7 = 200;
          goto LAB_0011a6c5;
        }
        iVar7 = 500;
      }
      local_72c = 0;
      goto LAB_0011a6c5;
    }
    iVar7 = 400;
  }
  else {
    iVar7 = 0x193;
  }
LAB_0011a6c2:
  local_72c = 0;
  bVar5 = false;
LAB_0011a6c5:
  free(in);
  pUVar11 = UpnpFileInfo_get_ExtraHeadersList(p);
  FreeExtraHTTPHeaders(pUVar11);
  UpnpFileInfo_delete(p);
  if (bVar5 && iVar7 != 200) {
    alias_release(&xmldoc);
  }
  if (iVar7 != 200) {
    http_SendStatusResponse(info,iVar7,req->major_version,req->minor_version);
    UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/webserver.c",0x71e,
               "webserver: request processed...\n");
    membuffer_destroy(&headers);
    membuffer_destroy(&filename);
    return;
  }
  (*(code *)(&DAT_0012e934 + *(int *)(&DAT_0012e934 + (ulong)local_72c * 4)))();
  return;
}

Assistant:

void web_server_callback(
	http_parser_t *parser, /* INOUT */ http_message_t *req, SOCKINFO *info)
{
	int ret;
	int timeout = -1;
	enum resp_type rtype = 0;
	membuffer headers;
	membuffer filename;
	struct xml_alias_t xmldoc;
	struct SendInstruction RespInstr;

	/* init */
	memset(&RespInstr, 0, sizeof(RespInstr));
	membuffer_init(&headers);
	membuffer_init(&filename);

	/* Process request should create the different kind of header depending
	 * on the type of request. */
	ret = process_request(
		info, req, &rtype, &headers, &filename, &xmldoc, &RespInstr);
	if (ret != HTTP_OK) {
		/* send error code */
		http_SendStatusResponse(
			info, ret, req->major_version, req->minor_version);
	} else {
		/* send response */
		switch (rtype) {
		case RESP_FILEDOC:
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_XMLDOC:
			http_SendMessage(info,
				&timeout,
				"Ibb",
				&RespInstr,
				headers.buf,
				headers.length,
				xmldoc.doc.buf,
				xmldoc.doc.length);
			alias_release(&xmldoc);
			break;
		case RESP_WEBDOC:
			/*http_SendVirtualDirDoc(info, &timeout, "Ibf",
				&RespInstr,
				headers.buf, headers.length,
				filename.buf);*/
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_HEADERS:
			/* headers only */
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		case RESP_POST:
			/* headers only */
			ret = http_RecvPostMessage(
				parser, info, filename.buf, &RespInstr);
			/* Send response. */
			http_MakeMessage(&headers,
				1,
				1,
				"RTLSXcCc",
				ret,
				"text/html",
				&RespInstr,
				X_USER_AGENT);
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		default:
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"webserver: Invalid response type received.\n");
			assert(0);
		}
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"webserver: request processed...\n");
	membuffer_destroy(&headers);
	membuffer_destroy(&filename);
}